

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Column_container *this_00;
  iterator iVar1;
  iterator iVar2;
  const_iterator cVar3;
  Index source;
  long *plVar4;
  __hashtable *__h;
  ID_index pivot;
  Index local_40;
  Index local_3c;
  ID_index local_38;
  Index local_34;
  
  local_34 = target;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
  ::_orderRowsIfNecessary(&this->reducedMatrixR_);
  this_00 = &(this->reducedMatrixR_).matrix_;
  local_40 = target;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_40);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    plVar4 = (long *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
                            ._M_cur + 0x38);
    if ((*(long **)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
                          ._M_cur + 0x38) != (long *)0x0 &&
         *(long **)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
                          ._M_cur + 0x38) != plVar4) &&
       (local_38 = *(ID_index *)
                    (*(long *)((long)iVar1.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
                                     ._M_cur + 0x40) + 0x10), local_38 != 0xffffffff)) {
      local_3c = eventIndex;
      do {
        local_40 = local_38;
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->pivotToColumnIndex_)._M_h,&local_40);
        if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          source = 0xffffffff;
        }
        else {
          source = *(Index *)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    ._M_cur + 0xc);
        }
        if (source == 0xffffffff) {
          std::__detail::
          _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::try_emplace<unsigned_int_const&,unsigned_int&>
                    ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->pivotToColumnIndex_,(const_iterator)0x0,&local_38,&local_34);
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
          ::_update_barcode((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
                             *)this,local_38,local_3c);
          return;
        }
        _reduce_column_by(this,target,source);
        eventIndex = local_3c;
      } while ((((long *)*plVar4 != (long *)0x0) && ((long *)*plVar4 != plVar4)) &&
              (local_38 = *(ID_index *)
                           (*(long *)((long)iVar1.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
                                            ._M_cur + 0x40) + 0x10), local_38 != 0xffffffff));
    }
    local_40 = target;
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_40);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
      ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>
                  *)this,*(Dimension *)
                          ((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_true,_true>_>_>_>,_false>
                                 ._M_cur + 0x20),eventIndex);
      return;
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}